

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec7SwapAdjacent(word *t,int v)

{
  ulong *puVar1;
  word wVar2;
  
  if (v == 5) {
    puVar1 = (ulong *)((long)t + 4);
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
  }
  else {
    if (4 < v) {
      __assert_fail("v < 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0x10a,"void If_Dec7SwapAdjacent(word *, int)");
    }
    wVar2 = If_Dec6SwapAdjacent(*t,v);
    *t = wVar2;
    wVar2 = If_Dec6SwapAdjacent(t[1],v);
    t[1] = wVar2;
  }
  return;
}

Assistant:

static inline void If_Dec7SwapAdjacent( word t[2], int v )
{
    if ( v == 5 )
    {
        unsigned Temp = (t[0] >> 32);
        t[0]  = (t[0] & 0xFFFFFFFF) | ((t[1] & 0xFFFFFFFF) << 32);
        t[1] ^= (t[1] & 0xFFFFFFFF) ^ Temp;
        return;
    }
    assert( v < 5 );
    t[0] = If_Dec6SwapAdjacent( t[0], v );
    t[1] = If_Dec6SwapAdjacent( t[1], v );
}